

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void age_death(CHAR_DATA *ch)

{
  bool bVar1;
  ROOM_INDEX_DATA *pRVar2;
  long in_RDI;
  OBJ_DATA *unaff_retaddr;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *in_stack_00000030;
  CHAR_DATA *in_stack_000012a8;
  CHAR_DATA *in_stack_000012b0;
  char *in_stack_00005c30;
  CHAR_DATA *in_stack_00005c38;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  int vnum;
  CHAR_DATA *ch_00;
  
  vnum = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  bVar1 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if ((!bVar1) && (pRVar2 = get_room_index(vnum), pRVar2 != (ROOM_INDEX_DATA *)0x0)) {
    pRVar2 = get_room_index(vnum);
    if (pRVar2 == (ROOM_INDEX_DATA *)0x0) {
      pRVar2 = get_room_index(vnum);
    }
    ch_00 = *(CHAR_DATA **)(in_RDI + 0x98);
    while (ch_00 != (CHAR_DATA *)0x0) {
      in_stack_ffffffffffffffe0 = ch_00->next_in_room;
      extract_obj(unaff_retaddr);
      ch_00 = in_stack_ffffffffffffffe0;
    }
    stop_fighting(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    make_corpse(in_stack_000012b0,in_stack_000012a8);
    char_from_room(in_stack_00000030);
    char_to_room((CHAR_DATA *)obj,(ROOM_INDEX_DATA *)obj_next);
    do_look(in_stack_00005c38,in_stack_00005c30);
    send_to_char((char *)pRVar2,ch_00);
  }
  return;
}

Assistant:

void age_death(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *pRoomIndex;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;

	if (is_npc(ch))
		return;

	pRoomIndex = get_room_index(1212);

	if (pRoomIndex == nullptr)
		return;

	/* For now default to the players recall, or midgaard */
	pRoomIndex = get_room_index(hometown_table[ch->hometown].recall);

	if (pRoomIndex == nullptr)
		pRoomIndex = get_room_index(ROOM_VNUM_TEMPLE);

	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		obj_next = obj->next_content;
		extract_obj(obj);
	}

	/* All items are poofed at age death */
	stop_fighting(ch, true);
	make_corpse(ch, ch);
	char_from_room(ch);
	char_to_room(ch, pRoomIndex);
	do_look(ch, "auto");

	send_to_char("You have died and become a permanent ghost, awaiting your final departure.\n\r", ch);
}